

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapIndexBuilder.cpp
# Opt level: O0

void __thiscall BitmapIndexBuilder::BitmapIndexBuilder(BitmapIndexBuilder *this,IndexType ntype)

{
  IndexType in_ESI;
  IndexBuilder *in_RDI;
  allocator_type *in_stack_ffffffffffffffe0;
  size_type in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  IndexBuilder::IndexBuilder(in_RDI,in_ESI);
  in_RDI->_vptr_IndexBuilder = (_func_int **)&PTR__BitmapIndexBuilder_002bdae0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1c1605);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1c1625);
  return;
}

Assistant:

BitmapIndexBuilder::BitmapIndexBuilder(IndexType ntype)
    : IndexBuilder(ntype), raw_data(file_run_size * NUM_TRIGRAMS) {}